

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsaes_oaep_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,uchar *label,size_t label_len,size_t ilen,uchar *input,uchar *output)

{
  ulong __n;
  byte bVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  int local_84;
  undefined1 local_80 [8];
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  uint hlen;
  uchar *p;
  int ret;
  size_t olen;
  size_t label_len_local;
  uchar *label_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if ((mode == 1) && (ctx->padding != 1)) {
    ctx_local._4_4_ = -0x4080;
  }
  else if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    md_ctx.hmac_ctx = mbedtls_md_info_from_type(ctx->hash_id);
    if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      __n = ctx->len;
      bVar1 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
      uVar2 = (uint)bVar1;
      if ((ilen + (ulong)bVar1 * 2 + 2 < ilen) || (__n < ilen + (ulong)bVar1 * 2 + 2)) {
        ctx_local._4_4_ = -0x4080;
      }
      else {
        memset(output,0,__n);
        puVar4 = output + 1;
        *output = '\0';
        iVar3 = (*f_rng)(p_rng,puVar4,(ulong)bVar1);
        if (iVar3 == 0) {
          puVar4 = puVar4 + uVar2;
          ctx_local._4_4_ = mbedtls_md((mbedtls_md_info_t *)md_ctx.hmac_ctx,label,label_len,puVar4);
          if (ctx_local._4_4_ == 0) {
            puVar4[((__n + (ulong)bVar1 * -2 + -2) - ilen) + (ulong)uVar2] = '\x01';
            if (ilen != 0) {
              memcpy(puVar4 + ((__n + (ulong)bVar1 * -2 + -2) - ilen) + (ulong)uVar2 + 1,input,ilen)
              ;
            }
            mbedtls_md_init((mbedtls_md_context_t *)local_80);
            p._4_4_ = mbedtls_md_setup((mbedtls_md_context_t *)local_80,
                                       (mbedtls_md_info_t *)md_ctx.hmac_ctx,0);
            if ((p._4_4_ == 0) &&
               (p._4_4_ = mgf_mask(output + (ulong)uVar2 + 1,(__n - uVar2) - 1,output + 1,
                                   (ulong)uVar2,(mbedtls_md_context_t *)local_80), p._4_4_ == 0)) {
              p._4_4_ = mgf_mask(output + 1,(ulong)uVar2,output + (ulong)uVar2 + 1,(__n - uVar2) - 1
                                 ,(mbedtls_md_context_t *)local_80);
            }
            mbedtls_md_free((mbedtls_md_context_t *)local_80);
            if (p._4_4_ == 0) {
              if (mode == 0) {
                local_84 = mbedtls_rsa_public(ctx,output,output);
              }
              else {
                local_84 = mbedtls_rsa_private(ctx,f_rng,p_rng,output,output);
              }
              ctx_local._4_4_ = local_84;
            }
            else {
              ctx_local._4_4_ = p._4_4_;
            }
          }
        }
        else {
          ctx_local._4_4_ = iVar3 + -0x4480;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsaes_oaep_encrypt( mbedtls_rsa_context *ctx,
                            int (*f_rng)(void *, unsigned char *, size_t),
                            void *p_rng,
                            int mode,
                            const unsigned char *label, size_t label_len,
                            size_t ilen,
                            const unsigned char *input,
                            unsigned char *output )
{
    size_t olen;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = output;
    unsigned int hlen;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( output != NULL );
    RSA_VALIDATE_RET( ilen == 0 || input != NULL );
    RSA_VALIDATE_RET( label_len == 0 || label != NULL );

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( f_rng == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;
    hlen = mbedtls_md_get_size( md_info );

    /* first comparison checks for overflow */
    if( ilen + 2 * hlen + 2 < ilen || olen < ilen + 2 * hlen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    memset( output, 0, olen );

    *p++ = 0;

    /* Generate a random octet string seed */
    if( ( ret = f_rng( p_rng, p, hlen ) ) != 0 )
        return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

    p += hlen;

    /* Construct DB */
    if( ( ret = mbedtls_md( md_info, label, label_len, p ) ) != 0 )
        return( ret );
    p += hlen;
    p += olen - 2 * hlen - 2 - ilen;
    *p++ = 1;
    if( ilen != 0 )
        memcpy( p, input, ilen );

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    /* maskedDB: Apply dbMask to DB */
    if( ( ret = mgf_mask( output + hlen + 1, olen - hlen - 1, output + 1, hlen,
                          &md_ctx ) ) != 0 )
        goto exit;

    /* maskedSeed: Apply seedMask to seed */
    if( ( ret = mgf_mask( output + 1, hlen, output + hlen + 1, olen - hlen - 1,
                          &md_ctx ) ) != 0 )
        goto exit;

exit:
    mbedtls_md_free( &md_ctx );

    if( ret != 0 )
        return( ret );

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, output, output )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, output, output ) );
}